

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O1

unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
wallet::coinselector_tests::NewWallet(NodeContext *m_node,string *wallet_name)

{
  Chain *chain;
  MockableData records;
  _Head_base<0UL,_kernel::Context_*,_false> this;
  string *in_RDX;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  readonly_property<bool> in_stack_ffffffffffffff50;
  readonly_property<bool> rVar1;
  undefined7 in_stack_ffffffffffffff51;
  undefined7 uVar2;
  shared_count sStack_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  unique_lock<std::recursive_mutex> local_78;
  undefined1 *local_68;
  undefined1 *local_60;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  chain = (Chain *)wallet_name[4]._M_dataplus._M_p;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl._0_8_ = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  records._M_t._M_impl._4_4_ = in_stack_ffffffffffffff2c;
  records._M_t._M_impl._0_4_ = in_stack_ffffffffffffff28;
  records._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = in_stack_ffffffffffffff30;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_ffffffffffffff38;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_ffffffffffffff40;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_ffffffffffffff48;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ =
       (readonly_property<bool>)
       (readonly_property<bool>)in_stack_ffffffffffffff50.super_class_property<bool>.value;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_ = in_stack_ffffffffffffff51;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase((wallet *)&stack0xffffffffffffff50,records);
  this._M_head_impl = (Context *)operator_new(0x4a8);
  local_78._M_device =
       (mutex_type *)
       CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50.super_class_property<bool>.value
               );
  rVar1.super_class_property<bool>.value = (class_property<bool>)0x0;
  uVar2 = 0;
  CWallet::CWallet((CWallet *)this._M_head_impl,chain,in_RDX,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_78);
  (m_node->kernel)._M_t.
  super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
  super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
  super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl = this._M_head_impl;
  if (local_78._M_device != (mutex_type *)0x0) {
    (**(code **)(((local_78._M_device)->super___recursive_mutex_base)._M_mutex.__align + 8))();
  }
  if ((long *)CONCAT71(uVar2,rVar1.super_class_property<bool>.value) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(uVar2,rVar1.super_class_property<bool>.value) + 8))();
  }
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_58);
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xb7;
  file.m_begin = (iterator)&local_88;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
  CWallet::LoadWallet((CWallet *)
                      (m_node->kernel)._M_t.
                      super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>
                      .super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl);
  sStack_a0.pi_ = (sp_counted_base *)0x0;
  local_60 = &stack0xffffffffffffff40;
  local_78._M_owns = false;
  local_78._M_device = (mutex_type *)&PTR__lazy_ostream_013abc70;
  local_68 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&stack0xffffffffffffff50,(lazy_ostream *)&local_78,1,0,WARN,
             0xf8004b,(size_t)&stack0xffffffffffffff30,0xb7);
  boost::detail::shared_count::~shared_count(&sStack_a0);
  local_78._M_device =
       (mutex_type *)
       ((m_node->kernel)._M_t.
        super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
        super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
        super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl + 0x1e8);
  local_78._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_78);
  CWallet::SetWalletFlag
            ((CWallet *)
             (m_node->kernel)._M_t.
             super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
             super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
             super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl,0x400000000);
  CWallet::SetupDescriptorScriptPubKeyMans
            ((CWallet *)
             (m_node->kernel)._M_t.
             super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
             super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
             super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (__uniq_ptr_data<wallet::CWallet,_std::default_delete<wallet::CWallet>,_true,_true>)
           (__uniq_ptr_data<wallet::CWallet,_std::default_delete<wallet::CWallet>,_true,_true>)
           m_node;
  }
  __stack_chk_fail();
}

Assistant:

static std::unique_ptr<CWallet> NewWallet(const node::NodeContext& m_node, const std::string& wallet_name = "")
{
    std::unique_ptr<CWallet> wallet = std::make_unique<CWallet>(m_node.chain.get(), wallet_name, CreateMockableWalletDatabase());
    BOOST_CHECK(wallet->LoadWallet() == DBErrors::LOAD_OK);
    LOCK(wallet->cs_wallet);
    wallet->SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
    wallet->SetupDescriptorScriptPubKeyMans();
    return wallet;
}